

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O0

void cpp_wrapper_equality
               (planck_unit_test_t *tc,Dictionary<int,_int> *dict,int key,int *expected_values,
               int expected_num_records,ion_boolean_t key_exists)

{
  int32_t expected;
  bool bVar1;
  planck_unit_result_t pVar2;
  int iVar3;
  int iVar4;
  Cursor<int,_int> *this;
  int local_48;
  bool local_41;
  int i;
  int iStack_3c;
  ion_cursor_status_t status;
  int curr_pos;
  int records_found;
  Cursor<int,_int> *cursor;
  ion_boolean_t key_exists_local;
  int expected_num_records_local;
  int *expected_values_local;
  int key_local;
  Dictionary<int,_int> *dict_local;
  planck_unit_test_t *tc_local;
  
  this = Dictionary<int,_int>::equality(dict,key);
  if (key_exists == '\0') {
    bVar1 = Cursor<int,_int>::hasNext(this);
    pVar2 = planck_unit_assert_true
                      (tc,(uint)((bVar1 ^ 0xffU) & 1),0x6e,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was true, expected false");
    if (pVar2 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    bVar1 = Cursor<int,_int>::next(this);
    pVar2 = planck_unit_assert_true
                      (tc,(uint)((bVar1 ^ 0xffU) & 1),0x6f,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was true, expected false");
    if (pVar2 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    if (this != (Cursor<int,_int> *)0x0) {
      Cursor<int,_int>::~Cursor(this);
      operator_delete(this);
    }
  }
  else {
    iStack_3c = 0;
    i = 0;
    bVar1 = Cursor<int,_int>::hasNext(this);
    pVar2 = planck_unit_assert_true
                      (tc,(uint)bVar1,0x79,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was false, expected true");
    if (pVar2 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    local_41 = Cursor<int,_int>::next(this);
    while (local_41 != false) {
      for (local_48 = 0; local_48 < key; local_48 = local_48 + 1) {
        iVar4 = expected_values[local_48];
        iVar3 = Cursor<int,_int>::getValue(this);
        if (iVar4 == iVar3) {
          i = local_48;
          break;
        }
      }
      iVar4 = Cursor<int,_int>::getKey(this);
      pVar2 = planck_unit_assert_int_are_equal
                        (tc,key,iVar4,0x85,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                        );
      if (pVar2 == '\0') {
        longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
      }
      expected = expected_values[i];
      iVar4 = Cursor<int,_int>::getValue(this);
      pVar2 = planck_unit_assert_int_are_equal
                        (tc,expected,iVar4,0x86,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                        );
      if (pVar2 == '\0') {
        longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
      }
      expected_values[i] = 999;
      local_41 = Cursor<int,_int>::next(this);
      iStack_3c = iStack_3c + 1;
    }
    bVar1 = Cursor<int,_int>::hasNext(this);
    pVar2 = planck_unit_assert_true
                      (tc,(uint)((bVar1 ^ 0xffU) & 1),0x8d,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was true, expected false");
    if (pVar2 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    pVar2 = planck_unit_assert_int_are_equal
                      (tc,expected_num_records,iStack_3c,0x90,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                      );
    if (pVar2 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    if (this != (Cursor<int,_int> *)0x0) {
      Cursor<int,_int>::~Cursor(this);
      operator_delete(this);
    }
  }
  return;
}

Assistant:

void
cpp_wrapper_equality(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict,
	int key,
	int expected_values[],
	int expected_num_records,
	ion_boolean_t key_exists
) {
	Cursor<int, int> *cursor = dict->equality(key);

	if (!key_exists) {
		PLANCK_UNIT_ASSERT_FALSE(tc, cursor->hasNext());
		PLANCK_UNIT_ASSERT_FALSE(tc, cursor->next());

		delete cursor;

		return;
	}

	int records_found	= 0;
	int curr_pos		= 0;

	PLANCK_UNIT_ASSERT_TRUE(tc, cursor->hasNext());

	ion_cursor_status_t status = cursor->next();

	while (status) {
		for (int i = 0; i < key; i++) {
			if (expected_values[i] == cursor->getValue()) {
				curr_pos = i;
				break;
			}
		}

		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, key, cursor->getKey());
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_values[curr_pos], cursor->getValue());

		expected_values[curr_pos]	= NULL_VALUE;
		status						= cursor->next();
		records_found++;
	}

	PLANCK_UNIT_ASSERT_FALSE(tc, cursor->hasNext());

	/* Check that same number of records are found as were inserted with desired key. */
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_num_records, records_found);

	delete cursor;
}